

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O0

void __thiscall
RenX_RelayPlugin::upstream_disconnected
          (RenX_RelayPlugin *this,Server *param_1,upstream_server_info *in_server_info)

{
  bool bVar1;
  reference ppuVar2;
  pointer pTVar3;
  upstream_server_info **server_ptr;
  iterator __end1;
  iterator __begin1;
  deque<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
  *__range1;
  upstream_server_info *in_server_info_local;
  Server *param_1_local;
  RenX_RelayPlugin *this_local;
  
  in_server_info->m_connected = false;
  std::
  deque<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
  ::begin((iterator *)&__end1._M_node,&this->m_command_tracker);
  std::
  deque<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
  ::end((iterator *)&server_ptr,&this->m_command_tracker);
  while (bVar1 = std::operator==((_Self *)&__end1._M_node,(_Self *)&server_ptr),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    ppuVar2 = std::
              _Deque_iterator<RenX_RelayPlugin::upstream_server_info_*,_RenX_RelayPlugin::upstream_server_info_*&,_RenX_RelayPlugin::upstream_server_info_**>
              ::operator*((_Deque_iterator<RenX_RelayPlugin::upstream_server_info_*,_RenX_RelayPlugin::upstream_server_info_*&,_RenX_RelayPlugin::upstream_server_info_**>
                           *)&__end1._M_node);
    if (*ppuVar2 == in_server_info) {
      *ppuVar2 = (upstream_server_info *)0x0;
    }
    std::
    _Deque_iterator<RenX_RelayPlugin::upstream_server_info_*,_RenX_RelayPlugin::upstream_server_info_*&,_RenX_RelayPlugin::upstream_server_info_**>
    ::operator++((_Deque_iterator<RenX_RelayPlugin::upstream_server_info_*,_RenX_RelayPlugin::upstream_server_info_*&,_RenX_RelayPlugin::upstream_server_info_**>
                  *)&__end1._M_node);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&in_server_info->m_socket);
  if (bVar1) {
    pTVar3 = std::unique_ptr<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>::
             operator->(&in_server_info->m_socket);
    (**(code **)(*(long *)pTVar3 + 0x28))();
  }
  return;
}

Assistant:

void RenX_RelayPlugin::upstream_disconnected(RenX::Server&, upstream_server_info& in_server_info) {
	in_server_info.m_connected = false;

	// Clear references to `in_server_info`
	for (auto& server_ptr : m_command_tracker) {
		if (server_ptr == &in_server_info) {
			server_ptr = nullptr;
		}
	}

	if (in_server_info.m_socket) {
		in_server_info.m_socket->close();
	}
}